

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O3

void set_title(char *title)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int extraout_EDX;
  long *plVar4;
  int *piVar5;
  char buffer [512];
  int iStack_a40;
  char cStack_a3c;
  undefined1 *puStack_938;
  long lStack_918;
  undefined1 *puStack_910;
  char *pcStack_908;
  undefined1 *puStack_900;
  undefined1 *puStack_8f8;
  undefined8 uStack_8f0;
  code *pcStack_8e8;
  undefined1 *puStack_8e0;
  undefined1 **ppuStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  long alStack_8a8 [17];
  undefined1 auStack_820 [511];
  undefined1 uStack_621;
  undefined1 auStack_620 [1024];
  char *pcStack_220;
  char acStack_208 [512];
  
  iVar1 = uv_get_process_title(acStack_208,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_00168430;
    iVar1 = uv_get_process_title(acStack_208,0x200);
    if (iVar1 != 0) goto LAB_00168435;
    iVar1 = strcmp(acStack_208,title);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    set_title_cold_1();
LAB_00168430:
    set_title_cold_2();
LAB_00168435:
    set_title_cold_3();
  }
  set_title_cold_4();
  plVar4 = &lStack_918;
  lStack_918 = 0x3ff;
  puVar3 = auStack_620;
  pcStack_220 = title;
  iVar1 = uv_exepath(puVar3);
  if (iVar1 == 0) {
    auStack_620[lStack_918] = 0;
    memset(auStack_820,0x78,0x1ff);
    uStack_621 = 0;
    ppuStack_8d8 = &puStack_910;
    pcStack_908 = "process_title_big_argv_helper";
    uStack_8f0 = 0;
    uStack_8d0 = 0;
    uStack_8c8 = 0;
    uStack_8c0 = 0;
    uStack_8b8 = 0;
    uStack_8b0 = 0;
    pcStack_8e8 = exit_cb;
    puStack_910 = puVar3;
    puStack_900 = auStack_820;
    puStack_8f8 = auStack_820;
    puStack_8e0 = puVar3;
    uVar2 = uv_default_loop();
    plVar4 = alStack_8a8;
    iVar1 = uv_spawn(uVar2,plVar4,&pcStack_8e8);
    if (iVar1 != 0) goto LAB_0016855b;
    uVar2 = uv_default_loop();
    plVar4 = (long *)0x0;
    iVar1 = uv_run(uVar2);
    if (iVar1 == 0) {
      puVar3 = (undefined1 *)uv_default_loop();
      uv_walk(puVar3,close_walk_cb,0);
      plVar4 = (long *)0x0;
      uv_run(puVar3);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00168565;
    }
  }
  else {
    run_test_process_title_big_argv_cold_1();
LAB_0016855b:
    run_test_process_title_big_argv_cold_2();
  }
  run_test_process_title_big_argv_cold_3();
LAB_00168565:
  run_test_process_title_big_argv_cold_4();
  if (plVar4 == (long *)0x0) {
    if (extraout_EDX == 0) {
      uv_close();
      return;
    }
  }
  else {
    exit_cb_cold_1();
  }
  exit_cb_cold_2();
  piVar5 = &iStack_a40;
  puStack_938 = puVar3;
  memset(&iStack_a40,0,0x100);
  iStack_a40 = 0x6c696166;
  uv_get_process_title(&iStack_a40,0x100);
  if (cStack_a3c != '\0' || iStack_a40 != 0x6c696166) {
    return;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(piVar5,0);
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  err = uv_set_process_title(title);
  ASSERT(err == 0);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  ASSERT(strcmp(buffer, title) == 0);
}